

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionShape::GetAABB
          (ChBeamSectionShape *this,double *ymin,double *ymax,double *zmin,double *zmax)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> mpoints;
  allocator_type local_49;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_48;
  
  *ymin = 1e+30;
  *ymax = -1e+30;
  *zmin = 1e+30;
  *zmax = -1e+30;
  iVar2 = (*this->_vptr_ChBeamSectionShape[2])();
  if (0 < iVar2) {
    uVar3 = 0;
    do {
      iVar2 = (*this->_vptr_ChBeamSectionShape[3])(this,(ulong)uVar3);
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::vector
                (&local_48,(long)iVar2,&local_49);
      (*this->_vptr_ChBeamSectionShape[4])(this,(ulong)uVar3,&local_48);
      while( true ) {
        iVar2 = (*this->_vptr_ChBeamSectionShape[3])(this,(ulong)uVar3);
        if (iVar2 < 1) break;
        dVar1 = (local_48.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_data[1];
        if (dVar1 < *ymin) {
          *ymin = dVar1;
          dVar1 = (local_48.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_data[1];
        }
        if (*ymax < dVar1) {
          *ymax = dVar1;
        }
        dVar1 = (local_48.
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_data[2];
        if (dVar1 < *zmin) {
          *zmin = dVar1;
          dVar1 = (local_48.
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_data[2];
        }
        if (*zmax < dVar1) {
          *zmax = dVar1;
        }
        uVar3 = uVar3 + 1;
      }
      if (local_48.
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar3 = uVar3 + 1;
      iVar2 = (*this->_vptr_ChBeamSectionShape[2])(this);
    } while ((int)uVar3 < iVar2);
  }
  return;
}

Assistant:

void ChBeamSectionShape::GetAABB(double& ymin, double& ymax, double& zmin, double& zmax) const {
    ymin = 1e30;
    ymax = -1e30;
    zmin = 1e30;
    zmax = -1e30;
    for (int nl = 0; nl < GetNofLines(); ++nl) {
        std::vector<ChVector<>> mpoints(GetNofPoints(nl));
        GetPoints(nl, mpoints);
        for (int np = 0; np < GetNofPoints(nl); ++nl) {
            if (mpoints[np].y() < ymin)
                ymin = mpoints[np].y();
            if (mpoints[np].y() > ymax)
                ymax = mpoints[np].y();
            if (mpoints[np].z() < zmin)
                zmin = mpoints[np].z();
            if (mpoints[np].z() > zmax)
                zmax = mpoints[np].z();
        }
    }
}